

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

int emulator_add_breakpoint(Emulator *e,Address addr,Bool enabled)

{
  int id;
  
  id = emulator_add_empty_breakpoint();
  if (-1 < id) {
    emulator_set_breakpoint_address(e,id,addr);
    emulator_enable_breakpoint(id,enabled);
  }
  return id;
}

Assistant:

int emulator_add_breakpoint(Emulator* e, Address addr, Bool enabled) {
  int id = emulator_add_empty_breakpoint();
  if (id < 0) {
    return id;
  }
  emulator_set_breakpoint_address(e, id, addr);
  emulator_enable_breakpoint(id, enabled);
  return id;
}